

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void * leveldb::anon_unknown_1::PosixEnv::BGThreadWrapper(void *arg)

{
  pthread_mutex_t *__mutex;
  undefined8 uVar1;
  code *pcVar2;
  long lVar3;
  uint uVar4;
  undefined8 *puVar5;
  int extraout_EDX;
  int result;
  int extraout_EDX_00;
  int result_00;
  PosixEnv *this;
  
  __mutex = (pthread_mutex_t *)((long)arg + 8);
  do {
    uVar4 = pthread_mutex_lock(__mutex);
    result = extraout_EDX;
    this = (PosixEnv *)0x123073;
    while( true ) {
      PthreadCall(this,(char *)(ulong)uVar4,result);
      puVar5 = *(undefined8 **)((long)arg + 0x80);
      if (*(undefined8 **)((long)arg + 0xa0) != puVar5) break;
      uVar4 = pthread_cond_wait((pthread_cond_t *)((long)arg + 0x30),__mutex);
      result = extraout_EDX_00;
      this = (PosixEnv *)"wait";
    }
    uVar1 = *puVar5;
    pcVar2 = (code *)puVar5[1];
    if (puVar5 == (undefined8 *)(*(long *)((long)arg + 0x90) + -0x10)) {
      operator_delete(*(void **)((long)arg + 0x88));
      lVar3 = *(long *)((long)arg + 0x98);
      *(long *)((long)arg + 0x98) = lVar3 + 8;
      puVar5 = *(undefined8 **)(lVar3 + 8);
      *(undefined8 **)((long)arg + 0x88) = puVar5;
      *(undefined8 **)((long)arg + 0x90) = puVar5 + 0x40;
    }
    else {
      puVar5 = puVar5 + 2;
    }
    *(undefined8 **)((long)arg + 0x80) = puVar5;
    uVar4 = pthread_mutex_unlock(__mutex);
    PthreadCall((PosixEnv *)"unlock",(char *)(ulong)uVar4,result_00);
    (*pcVar2)(uVar1);
  } while( true );
}

Assistant:

static void *BGThreadWrapper(void *arg) {
                reinterpret_cast<PosixEnv *>(arg)->BGThread();
                return NULL;
            }